

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

bool fmt::v9::detail::check_cstring_type_spec<fmt::v9::detail::error_handler>
               (presentation_type type,error_handler *eh)

{
  error_handler *eh_local;
  presentation_type type_local;
  
  if (((type == none) || (type == string)) || (type == debug)) {
    eh_local._7_1_ = true;
  }
  else {
    if (type != pointer) {
      error_handler::on_error(eh,"invalid type specifier");
    }
    eh_local._7_1_ = false;
  }
  return eh_local._7_1_;
}

Assistant:

FMT_CONSTEXPR auto check_cstring_type_spec(presentation_type type,
                                           ErrorHandler&& eh = {}) -> bool {
  if (type == presentation_type::none || type == presentation_type::string ||
      type == presentation_type::debug)
    return true;
  if (type != presentation_type::pointer) eh.on_error("invalid type specifier");
  return false;
}